

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray
          (ExtensionSet *this,uint8 *target,EpsCopyOutputStream *stream)

{
  LargeMap *pLVar1;
  KeyValue *pKVar2;
  KeyValue *pKVar3;
  _Base_ptr p_Var4;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_> it;
  anon_class_16_2_d2ac9ea8 local_40;
  uint8 *local_30;
  uint8 *target_local;
  
  local_40.stream = stream;
  local_30 = target;
  if (this->flat_capacity_ < 0x101) {
    pKVar2 = flat_begin(this);
    pKVar3 = flat_end(this);
    local_40.target = &local_30;
    for (; pKVar2 != pKVar3; pKVar2 = pKVar2 + 1) {
      InternalSerializeMessageSetWithCachedSizesToArray::anon_class_16_2_d2ac9ea8::operator()
                (&local_40,pKVar2->first,&pKVar2->second);
    }
  }
  else {
    pLVar1 = (this->map_).large;
    local_40.target = &local_30;
    for (p_Var4 = (pLVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(pLVar1->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      InternalSerializeMessageSetWithCachedSizesToArray::anon_class_16_2_d2ac9ea8::operator()
                (&local_40,p_Var4[1]._M_color,(Extension *)&p_Var4[1]._M_parent);
    }
  }
  return local_30;
}

Assistant:

uint8* ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(
    uint8* target, io::EpsCopyOutputStream* stream) const {
  ForEach([&target, stream](int number, const Extension& ext) {
    target = ext.InternalSerializeMessageSetItemWithCachedSizesToArray(
        number, target, stream);
  });
  return target;
}